

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_wait_for_edge_falling(APITests *this)

{
  void *__stat_loc;
  long in_RDI;
  WaitResult result;
  future<void> dsc;
  size_t *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  allocator *paVar1;
  double in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  int channel;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa7;
  WaitResult local_38 [32];
  __basic_future<void> local_18;
  
  channel = 0;
  GPIO::setmode(BOARD);
  GPIO::setup(*(int *)(in_RDI + 0x20),OUT,1);
  GPIO::setup(*(int *)(in_RDI + 0x24),IN,-1);
  DelayedSetChannel(channel,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  __stat_loc = (void *)(ulong)*(Edge *)(in_RDI + 0x24);
  GPIO::wait_for_edge((int)local_38,*(Edge *)(in_RDI + 0x24),3,10);
  std::__basic_future<void>::wait(&local_18,__stat_loc);
  GPIO::WaitResult::channel_abi_cxx11_(local_38);
  std::__cxx11::stoi(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0);
  paVar1 = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff98,"",paVar1);
  assert::is_true((bool)in_stack_ffffffffffffffa7,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  GPIO::WaitResult::is_event_detected();
  paVar1 = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",paVar1);
  assert::is_true((bool)in_stack_ffffffffffffffa7,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  GPIO::cleanup();
  GPIO::WaitResult::~WaitResult((WaitResult *)0x1433cb);
  std::future<void>::~future((future<void> *)0x1433d8);
  return;
}

Assistant:

void test_wait_for_edge_falling()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::HIGH);
        GPIO::setup(pin_data.in_a, GPIO::IN);
        auto dsc = DelayedSetChannel(pin_data.out_a, GPIO::LOW, 0.5);
        auto result = GPIO::wait_for_edge(pin_data.in_a, GPIO::FALLING, 10, 1000);
        dsc.wait();
        assert::is_true(std::stoi(result.channel()) == pin_data.in_a);
        assert::is_true(result.is_event_detected());
        GPIO::cleanup();
    }